

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O2

int __thiscall deqp::ShaderIntegerMixTests::init(ShaderIntegerMixTests *this,EVP_PKEY_CTX *ctx)

{
  char *_type;
  Context *context;
  char *name_00;
  TestNode *pTVar1;
  undefined8 extraout_RAX;
  ostream *poVar2;
  ShaderIntegerMixRenderCase *this_00;
  undefined8 uVar3;
  long lVar4;
  char *local_380 [4];
  char *local_360 [4];
  stringstream description;
  ostream local_330;
  stringstream name;
  ostream local_1a8;
  
  pTVar1 = (TestNode *)operator_new(0x80);
  ShaderIntegerMixDefineCase::ShaderIntegerMixDefineCase
            ((ShaderIntegerMixDefineCase *)pTVar1,(this->super_TestCaseGroup).m_context,"define",
             "Verify GL_EXT_shader_integer_mix is defined to 1.",this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  ShaderIntegerMixPrototypesCase::ShaderIntegerMixPrototypesCase
            ((ShaderIntegerMixPrototypesCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "prototypes-extension",
             "Verify availability of all function signatures with the extension.",
             this->m_glslVersion,true);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  ShaderIntegerMixPrototypesCase::ShaderIntegerMixPrototypesCase
            ((ShaderIntegerMixPrototypesCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "prototypes",
             "Verify availability of all function signatures with the proper GLSL version.",
             this->m_glslVersion,false);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  uVar3 = extraout_RAX;
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
    std::__cxx11::stringstream::stringstream((stringstream *)&name);
    poVar2 = std::operator<<(&local_1a8,"mix-");
    _type = *(char **)((long)init::types_to_test + lVar4);
    std::operator<<(poVar2,_type);
    std::__cxx11::stringstream::stringstream((stringstream *)&description);
    poVar2 = std::operator<<(&local_330,"Verify functionality of mix() with ");
    poVar2 = std::operator<<(poVar2,_type);
    std::operator<<(poVar2," parameters.");
    this_00 = (ShaderIntegerMixRenderCase *)operator_new(0x88);
    context = (this->super_TestCaseGroup).m_context;
    std::__cxx11::stringbuf::str();
    name_00 = local_360[0];
    std::__cxx11::stringbuf::str();
    ShaderIntegerMixRenderCase::ShaderIntegerMixRenderCase
              (this_00,context,name_00,local_380[0],this->m_glslVersion,_type);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_380);
    std::__cxx11::string::~string((string *)local_360);
    std::__cxx11::stringstream::~stringstream((stringstream *)&description);
    uVar3 = std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  }
  return (int)uVar3;
}

Assistant:

void ShaderIntegerMixTests::init(void)
{
	addChild(new ShaderIntegerMixDefineCase(m_context, "define", "Verify GL_EXT_shader_integer_mix is defined to 1.",
											m_glslVersion));
	addChild(new ShaderIntegerMixPrototypesCase(m_context, "prototypes-extension",
												"Verify availability of all function signatures with the extension.",
												m_glslVersion, true));
	addChild(new ShaderIntegerMixPrototypesCase(
		m_context, "prototypes", "Verify availability of all function signatures with the proper GLSL version.",
		m_glslVersion, false));

	static const char* types_to_test[] = { "ivec4", "uvec4", "bvec4" };

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(types_to_test); i++)
	{
		std::stringstream name;

		name << "mix-" << types_to_test[i];

		std::stringstream description;

		description << "Verify functionality of mix() with " << types_to_test[i] << " parameters.";

		addChild(new ShaderIntegerMixRenderCase(m_context, name.str().c_str(), description.str().c_str(), m_glslVersion,
												types_to_test[i]));
	}
}